

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall
jpge::jpeg_encoder::compute_huffman_table
          (jpeg_encoder *this,uint *codes,uint8 *code_sizes,uint8 *bits,uint8 *val)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int l;
  long lVar10;
  uint8 huff_size [257];
  uint huff_code [257];
  byte local_548 [272];
  uint local_438 [258];
  
  uVar6 = 0;
  lVar10 = 1;
  do {
    bVar1 = bits[lVar10];
    if (bVar1 != 0) {
      memset(local_548 + (int)uVar6,(int)lVar10,(ulong)bVar1);
      uVar6 = uVar6 + bVar1;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x11);
  local_548[(int)uVar6] = 0;
  uVar3 = (uint)local_548[0];
  if (local_548[0] != 0) {
    iVar4 = 0;
    iVar7 = 0;
    do {
      if (uVar3 == local_548[0]) {
        lVar10 = (long)iVar4;
        lVar8 = lVar10 << 0x20;
        lVar9 = 0;
        do {
          lVar8 = lVar8 + 0x100000000;
          local_438[lVar10 + lVar9] = iVar7 + (int)lVar9;
          lVar2 = lVar9 + lVar10;
          lVar9 = lVar9 + 1;
        } while (uVar3 == local_548[lVar2 + 1]);
        iVar4 = iVar4 + (int)lVar9;
        local_548[0] = local_548[lVar8 >> 0x20];
        iVar7 = iVar7 + (int)lVar9;
      }
      iVar7 = iVar7 * 2;
      uVar3 = uVar3 + 1;
    } while (local_548[0] != 0);
  }
  memset(codes,0,0x400);
  memset(code_sizes,0,0x100);
  if (0 < (int)uVar6) {
    uVar5 = 0;
    do {
      codes[val[uVar5]] = local_438[uVar5];
      code_sizes[val[uVar5]] = local_548[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

void jpeg_encoder::compute_huffman_table(uint* codes, uint8* code_sizes, uint8* bits, uint8* val)
	{
		int i, l, last_p, si;
		uint8 huff_size[257];
		uint huff_code[257];
		uint code;

		int p = 0;
		for (l = 1; l <= 16; l++)
			for (i = 1; i <= bits[l]; i++)
				huff_size[p++] = (char)l;

		huff_size[p] = 0; last_p = p; // write sentinel

		code = 0; si = huff_size[0]; p = 0;

		while (huff_size[p])
		{
			while (huff_size[p] == si)
				huff_code[p++] = code++;
			code <<= 1;
			si++;
		}

		memset(codes, 0, sizeof(codes[0]) * 256);
		memset(code_sizes, 0, sizeof(code_sizes[0]) * 256);
		for (p = 0; p < last_p; p++)
		{
			codes[val[p]] = huff_code[p];
			code_sizes[val[p]] = huff_size[p];
		}
	}